

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

void __thiscall CaptureSummary::~CaptureSummary(CaptureSummary *this)

{
  size_type sVar1;
  reference pp_Var2;
  ulong local_18;
  size_t i;
  CaptureSummary *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size(&this->summary);
    if (sVar1 <= local_18) break;
    pp_Var2 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                        (&this->summary,local_18);
    if (*pp_Var2 != (value_type)0x0) {
      pp_Var2 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                          (&this->summary,local_18);
      if (*pp_Var2 != (value_type)0x0) {
        operator_delete(*pp_Var2);
      }
      pp_Var2 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                          (&this->summary,local_18);
      *pp_Var2 = (value_type)0x0;
    }
    local_18 = local_18 + 1;
  }
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::~vector(&this->summary);
  return;
}

Assistant:

CaptureSummary::~CaptureSummary()
{
    for (size_t i = 0; i < summary.size(); i++)
    {
        if (summary[i] != NULL)
        {
            delete summary[i];
            summary[i] = NULL;
        }
    }
}